

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# area_light.h
# Opt level: O1

void __thiscall
CGL::GLScene::AreaLight::AreaLight(AreaLight *this,LightInfo *light_info,Matrix4x4 *transform)

{
  double dVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128d adVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_98;
  Vector4D local_78;
  double local_58;
  double dStack_50;
  double dStack_48;
  undefined8 uStack_40;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_get_static_light_002a58b0;
  (this->spectrum).field_0.field_0.x = 0.0;
  (this->spectrum).field_0.field_0.y = 0.0;
  (this->spectrum).field_0.field_0.z = 0.0;
  (this->position).field_0.field_0.x = 0.0;
  (this->position).field_0.field_0.y = 0.0;
  (this->position).field_0.field_0.z = 0.0;
  (this->direction).field_0.field_0.x = 0.0;
  (this->direction).field_0.field_0.y = 0.0;
  (this->direction).field_0.field_0.z = 0.0;
  (this->dim_x).field_0.field_0.x = 0.0;
  (this->dim_x).field_0.field_0.y = 0.0;
  (this->dim_x).field_0.field_0.z = 0.0;
  (this->dim_y).field_0.field_0.x = 0.0;
  (this->dim_y).field_0.field_0.y = 0.0;
  (this->dim_y).field_0.field_0.z = 0.0;
  dVar10 = (light_info->spectrum).field_0.field_0.y;
  dVar1 = (light_info->spectrum).field_0.field_0.z;
  uVar2 = *(undefined8 *)((long)&(light_info->spectrum).field_0 + 0x18);
  (this->spectrum).field_0.field_0.x = (light_info->spectrum).field_0.field_0.x;
  (this->spectrum).field_0.field_0.y = dVar10;
  (this->spectrum).field_0.field_0.z = dVar1;
  *(undefined8 *)((long)&(this->spectrum).field_0 + 0x18) = uVar2;
  local_98.field_0.x = (light_info->position).field_0.field_0.x;
  local_98.field_0.y = (light_info->position).field_0.field_0.y;
  local_98.field_0.z = (light_info->position).field_0.field_0.z;
  local_98.field_0.w = 1.0;
  Matrix4x4::operator*(transform,(Vector4D *)&local_98.field_0);
  Vector4D::to3D(&local_78);
  (this->position).field_0.field_0.x = local_58;
  (this->position).field_0.field_0.y = dStack_50;
  (this->position).field_0.field_0.z = dStack_48;
  *(undefined8 *)((long)&(this->position).field_0 + 0x18) = uStack_40;
  local_98.field_2.xy = (__m128d)*(undefined1 (*) [16])(light_info->direction).field_0.field_2.__vec
  ;
  local_98.field_0.z = (light_info->direction).field_0.field_0.z;
  local_98.field_0.w = 1.0;
  Matrix4x4::operator*(transform,(Vector4D *)&local_98.field_0);
  Vector4D::to3D(&local_78);
  auVar3._8_8_ = dStack_50;
  auVar3._0_8_ = local_58;
  auVar3 = vsubpd_avx(auVar3,*(undefined1 (*) [16])(this->position).field_0.field_2.__vec);
  dVar10 = dStack_48 - (this->position).field_0.field_0.z;
  *(undefined1 (*) [16])(this->direction).field_0.field_2.__vec = auVar3;
  (this->direction).field_0.field_0.z = dVar10;
  auVar3 = vdppd_avx(auVar3,auVar3,0x31);
  dVar10 = dVar10 * dVar10 + auVar3._0_8_;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar10;
    auVar3 = vsqrtsd_avx(auVar11,auVar11);
    dVar10 = auVar3._0_8_;
  }
  dVar10 = 1.0 / dVar10;
  dVar1 = (this->direction).field_0.field_0.y;
  (this->direction).field_0.field_0.x = dVar10 * (this->direction).field_0.field_0.x;
  (this->direction).field_0.field_0.y = dVar10 * dVar1;
  (this->direction).field_0.field_0.z = dVar10 * (this->direction).field_0.field_0.z;
  dVar10 = (light_info->direction).field_0.field_0.x;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar10;
  dVar1 = (light_info->up).field_0.field_0.x;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1;
  dVar4 = (light_info->direction).field_0.field_0.y;
  dVar5 = (light_info->up).field_0.field_0.y;
  adVar9 = *&(light_info->up).field_0.field_2.__vec;
  dVar6 = (light_info->up).field_0.field_0.z;
  uVar2 = *(undefined8 *)((long)&(light_info->up).field_0 + 0x10);
  auVar13._8_8_ = uVar2;
  auVar13._0_8_ = uVar2;
  auVar3 = vunpcklpd_avx(auVar13,auVar17);
  auVar14._0_8_ = dVar4 * auVar3._0_8_;
  auVar14._8_8_ = (light_info->direction).field_0.field_0.z * auVar3._8_8_;
  uVar2 = *(undefined8 *)((long)&(light_info->direction).field_0 + 0x10);
  auVar15._8_8_ = uVar2;
  auVar15._0_8_ = uVar2;
  auVar3 = vunpcklpd_avx(auVar15,auVar12);
  auVar16._0_8_ = dVar5 * auVar3._0_8_;
  auVar16._8_8_ = dVar6 * auVar3._8_8_;
  local_98.field_2.xy = (__m128d)vsubpd_avx(auVar16,auVar14);
  local_98.field_0.z = dVar1 * dVar4 - dVar10 * dVar5;
  local_98.field_0.w = 1.0;
  Matrix4x4::operator*(transform,(Vector4D *)&local_98.field_0);
  Vector4D::to3D(&local_78);
  auVar7._8_8_ = dStack_50;
  auVar7._0_8_ = local_58;
  auVar3 = vsubpd_avx(auVar7,*(undefined1 (*) [16])(this->position).field_0.field_2.__vec);
  dVar10 = (this->position).field_0.field_0.z;
  *(undefined1 (*) [16])(this->dim_x).field_0.field_2.__vec = auVar3;
  (this->dim_x).field_0.field_0.z = dStack_48 - dVar10;
  local_98.field_0.w = 1.0;
  local_98.field_2.xy = (__m128d)(undefined1  [16])adVar9;
  local_98.field_0.z = dVar6;
  Matrix4x4::operator*(transform,(Vector4D *)&local_98.field_0);
  Vector4D::to3D(&local_78);
  auVar8._8_8_ = dStack_50;
  auVar8._0_8_ = local_58;
  auVar3 = vsubpd_avx(auVar8,*(undefined1 (*) [16])(this->position).field_0.field_2.__vec);
  dVar10 = (this->position).field_0.field_0.z;
  *(undefined1 (*) [16])(this->dim_y).field_0.field_2.__vec = auVar3;
  (this->dim_y).field_0.field_0.z = dStack_48 - dVar10;
  return;
}

Assistant:

AreaLight(const Collada::LightInfo& light_info, 
            const Matrix4x4& transform) {

    this->spectrum = light_info.spectrum;
    this->position = (transform * Vector4D(light_info.position, 1)).to3D();
    this->direction = (transform * Vector4D(light_info.direction, 1)).to3D() - position;
    this->direction.normalize();
    
    Vector3D dim_y = light_info.up;
    Vector3D dim_x = cross(light_info.up, light_info.direction);

    this->dim_x = (transform * Vector4D(dim_x, 1)).to3D() - position;
    this->dim_y = (transform * Vector4D(dim_y, 1)).to3D() - position;
  }